

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O2

t_operand __thiscall
xemmai::ast::t_throw::f_emit(t_throw *this,t_emit *a_emit,bool a_tail,bool a_operand,bool a_clear)

{
  t_node *ptVar1;
  t_emit *this_00;
  anon_union_8_4_0f1077ea_for_t_operand_2 extraout_RDX;
  undefined7 in_register_00000081;
  t_operand tVar2;
  
  ptVar1 = (this->v_expression)._M_t.
           super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>.
           _M_t.
           super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>.
           super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl;
  (*ptVar1->_vptr_t_node[3])(ptVar1,a_emit,0,0,0);
  t_emit::f_emit_safe_point(a_emit,&this->super_t_node);
  a_emit->v_stack = a_emit->v_stack - 1;
  this_00 = t_emit::operator<<(a_emit,c_instruction__THROW);
  t_emit::operator<<(this_00,a_emit->v_stack);
  if ((int)CONCAT71(in_register_00000081,a_clear) == 0) {
    t_emit::f_push(a_emit);
  }
  t_emit::f_at(a_emit,&this->super_t_node);
  tVar2.field_1.v_integer = extraout_RDX.v_integer;
  tVar2._0_8_ = 4;
  return tVar2;
}

Assistant:

t_operand t_throw::f_emit(t_emit& a_emit, bool a_tail, bool a_operand, bool a_clear)
{
	v_expression->f_emit(a_emit, false, false);
	a_emit.f_emit_safe_point(this);
	a_emit.f_pop();
	a_emit << c_instruction__THROW << a_emit.v_stack;
	if (!a_clear) a_emit.f_push();
	a_emit.f_at(this);
	return {};
}